

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<unsigned_char>::setCapacity(Vector<unsigned_char> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<unsigned_char> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<unsigned_char> newBuilder;
  size_t newSize_local;
  Vector<unsigned_char> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<unsigned_char>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<unsigned_char>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<unsigned_char>
            ((ArrayBuilder<unsigned_char> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<unsigned_char>>(&this->builder);
  ArrayBuilder<unsigned_char>::addAll<kj::ArrayBuilder<unsigned_char>>
            ((ArrayBuilder<unsigned_char> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<unsigned_char>>((ArrayBuilder<unsigned_char> *)local_38);
  ArrayBuilder<unsigned_char>::operator=(&this->builder,pAVar2);
  ArrayBuilder<unsigned_char>::~ArrayBuilder((ArrayBuilder<unsigned_char> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }